

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O3

dropt_error
handle_optional_uint
          (dropt_context *context,dropt_option *option,dropt_char *optionArgument,void *dest)

{
  dropt_error dVar1;
  optional_uint *p;
  
  if (dest == (void *)0x0) {
    dropt_misuse("No handler data specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/test_dropt.c"
                 ,0x8a);
    dVar1 = 2;
  }
  else {
    if ((optionArgument != (dropt_char *)0x0) && (dVar1 = dropt_handle_uint(), dVar1 != 0)) {
      return dVar1;
    }
    *(undefined4 *)dest = 1;
    dVar1 = 0;
  }
  return dVar1;
}

Assistant:

static dropt_error
handle_optional_uint(dropt_context* context,
                     const dropt_option* option,
                     const dropt_char* optionArgument,
                     void* dest)
{
    dropt_error err = dropt_error_none;

    if (dest == NULL)
    {
        DROPT_MISUSE("No handler data specified.");
        err = dropt_error_bad_configuration;
    }
    else
    {
        optional_uint* p = dest;

        if (optionArgument != NULL)
        {
            err = dropt_handle_uint(context, option, optionArgument,
                                    &(p->value));
        }

        if (err == dropt_error_none) { p->is_set = true; }
    }

    return err;
}